

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O0

void anon_unknown.dwarf_23dc62::check<unsigned_int>(istream *is,uint c)

{
  char *pcVar1;
  ostream *poVar2;
  void *this;
  uint in_ESI;
  uint v;
  uint *in_stack_ffffffffffffffe8;
  uint in_stack_fffffffffffffff0;
  
  Imf_3_2::Xdr::read<(anonymous_namespace)::CharIO,std::istream>
            ((basic_istream<char,_std::char_traits<char>_> *)
             CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
  pcVar1 = std::type_info::name((type_info *)&unsigned_int::typeinfo);
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar1);
  poVar2 = std::operator<<(poVar2,": expected ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,in_ESI);
  poVar2 = std::operator<<(poVar2,", got ");
  this = (void *)std::ostream::operator<<(poVar2,in_stack_fffffffffffffff0);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  if (in_ESI == in_stack_fffffffffffffff0) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testXdr.cpp"
                ,99,"void (anonymous namespace)::check(istream &, T) [T = unsigned int]");
}

Assistant:

void
check (istream& is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid (v).name () << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}